

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

_Bool gravity_value_equals(gravity_value_t v1,gravity_value_t v2)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_range_t *r2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  gravity_class_t *pgVar6;
  long lVar7;
  gravity_range_t *r1;
  gravity_value_t v1_00;
  gravity_value_t v2_00;
  
  aVar4 = v2.field_1;
  aVar5 = v1.field_1;
  pgVar6 = v1.isa;
  if (pgVar6 == v2.isa) {
    if (((gravity_class_int == pgVar6) || (gravity_class_bool == pgVar6)) ||
       (gravity_class_null == pgVar6)) {
      return aVar5.n == aVar4.n;
    }
    if (gravity_class_float == pgVar6) {
      return ABS(aVar5.f - aVar4.f) < 1e-06;
    }
    if (gravity_class_string == pgVar6) {
      if ((*(int *)&(aVar5.p)->identifier == *(int *)&(aVar4.p)->identifier) &&
         (uVar1 = *(uint *)((long)&(aVar5.p)->identifier + 4),
         uVar1 == *(uint *)((long)&(aVar4.p)->identifier + 4))) {
        iVar3 = bcmp((aVar5.p)->objclass,(aVar4.p)->objclass,(ulong)uVar1);
        return iVar3 == 0;
      }
    }
    else if (gravity_class_range == pgVar6) {
      if ((aVar5.p)->objclass == (aVar4.p)->objclass) {
        return (aVar5.p)->identifier == (aVar4.p)->identifier;
      }
    }
    else {
      if (gravity_class_list != pgVar6) {
        if (gravity_class_map != pgVar6) {
          return aVar5.n == aVar4.n && (aVar5.p)->isa == (aVar4.p)->isa;
        }
        _Var2 = gravity_hash_compare
                          ((gravity_hash_t *)(aVar5.p)->objclass,
                           (gravity_hash_t *)(aVar4.p)->objclass,hash_value_compare_cb,(void *)0x0);
        return _Var2;
      }
      pgVar6 = (aVar5.p)->objclass;
      if (pgVar6 == (aVar4.p)->objclass) {
        if (pgVar6 == (gravity_class_t *)0x0) {
          return true;
        }
        lVar7 = 8;
        do {
          pgVar6 = (gravity_class_t *)((long)&pgVar6[-1].ivars + 7);
          v1_00.field_1.n =
               ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
               (*(long *)&(aVar5.p)->has_outer + lVar7))->n;
          v1_00.isa = *(gravity_class_t **)(*(long *)&(aVar5.p)->has_outer + -8 + lVar7);
          v2_00.field_1.n =
               ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)
               (*(long *)&(aVar4.p)->has_outer + lVar7))->n;
          v2_00.isa = *(gravity_class_t **)(*(long *)&(aVar4.p)->has_outer + -8 + lVar7);
          _Var2 = gravity_value_equals(v1_00,v2_00);
          if (!_Var2) {
            return _Var2;
          }
          lVar7 = lVar7 + 0x10;
        } while (pgVar6 != (gravity_class_t *)0x0);
        return _Var2;
      }
    }
  }
  return false;
}

Assistant:

bool gravity_value_equals (gravity_value_t v1, gravity_value_t v2) {

    // check same class
    if (v1.isa != v2.isa) return false;

    // check same value for value types
    if ((v1.isa == gravity_class_int) || (v1.isa == gravity_class_bool) || (v1.isa == gravity_class_null)) {
        return (v1.n == v2.n);
    } else if (v1.isa == gravity_class_float) {
        #if GRAVITY_ENABLE_DOUBLE
        return (fabs(v1.f - v2.f) < EPSILON);
        #else
        return (fabsf(v1.f - v2.f) < EPSILON);
        #endif
    } else if (v1.isa == gravity_class_string) {
        gravity_string_t *s1 = VALUE_AS_STRING(v1);
        gravity_string_t *s2 = VALUE_AS_STRING(v2);
        if (s1->hash != s2->hash) return false;
        if (s1->len != s2->len) return false;
        // same hash and same len so let's compare bytes
        return (memcmp(s1->s, s2->s, s1->len) == 0);
    } else if (v1.isa == gravity_class_range) {
        gravity_range_t *r1 = VALUE_AS_RANGE(v1);
        gravity_range_t *r2 = VALUE_AS_RANGE(v2);
        return ((r1->from == r2->from) && (r1->to == r2->to));
    } else if (v1.isa == gravity_class_list) {
        gravity_list_t *list1 = VALUE_AS_LIST(v1);
        gravity_list_t *list2 = VALUE_AS_LIST(v2);
        if (marray_size(list1->array) != marray_size(list2->array)) return false;
        size_t count = marray_size(list1->array);
        for (size_t i=0; i<count; ++i) {
            gravity_value_t value1 = marray_get(list1->array, i);
            gravity_value_t value2 = marray_get(list2->array, i);
            if (!gravity_value_equals(value1, value2)) return false;
        }
        return true;
    } else if (v1.isa == gravity_class_map) {
        gravity_map_t *map1 = VALUE_AS_MAP(v1);
        gravity_map_t *map2 = VALUE_AS_MAP(v2);
        return gravity_hash_compare(map1->hash, map2->hash, hash_value_compare_cb, NULL);
    }

    // if here means that they are two heap allocated objects
    gravity_object_t *obj1 = VALUE_AS_OBJECT(v1);
    gravity_object_t *obj2 = VALUE_AS_OBJECT(v2);
    if (obj1->isa != obj2->isa) return false;

    return (obj1 == obj2);
}